

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O2

int __thiscall
Fl_Input_Choice_Type::textstuff(Fl_Input_Choice_Type *this,int w,Fl_Font *f,int *s,Fl_Color *c)

{
  Fl_Type *pFVar1;
  char *pcVar2;
  
  if (w == 4) {
    this = (Fl_Input_Choice_Type *)
           (this->super_Fl_Menu_Type).super_Fl_Widget_Type.super_Fl_Type.factory;
  }
  if ((uint)w < 5) {
    pFVar1 = ((Fl_Type *)((long)this + 0x78))->prev;
    switch(w) {
    default:
      pcVar2 = pFVar1[1].user_data_type_;
      *f = *(Fl_Font *)(pcVar2 + 0xb4);
      *s = *(int *)(pcVar2 + 0xb8);
      *c = *(Fl_Color *)(pcVar2 + 0xbc);
      break;
    case 1:
      *(Fl_Font *)(pFVar1[1].user_data_type_ + 0xb4) = *f;
      break;
    case 2:
      *(int *)(pFVar1[1].user_data_type_ + 0xb8) = *s;
      break;
    case 3:
      *(Fl_Color *)(pFVar1[1].user_data_type_ + 0xbc) = *c;
    }
  }
  return 1;
}

Assistant:

int textstuff(int w, Fl_Font& f, int& s, Fl_Color& c) {
    Fl_Input_Choice *myo = (Fl_Input_Choice*)(w==4 ? ((Fl_Widget_Type*)this->factory)->o : this->o);
    switch (w) {
    case 4:
    case 0: f = (Fl_Font)myo->textfont(); s = myo->textsize(); c = myo->textcolor(); break;
    case 1: myo->textfont(f); break;
    case 2: myo->textsize(s); break;
    case 3: myo->textcolor(c); break;
    }
    return 1;
  }